

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnlyImpl<wchar_t>(int *argc,wchar_t **argv)

{
  bool bVar1;
  int iVar2;
  wchar_t **in_RDX;
  wchar_t **extraout_RDX;
  wchar_t **extraout_RDX_00;
  wchar_t **extraout_RDX_01;
  wchar_t **extraout_RDX_02;
  wchar_t **extraout_RDX_03;
  wchar_t **extraout_RDX_04;
  wchar_t **extraout_RDX_05;
  wchar_t **extraout_RDX_06;
  long lVar3;
  undefined1 auVar4 [8];
  int iVar5;
  undefined1 local_60 [8];
  string arg_string;
  
  auVar4 = (undefined1  [8])argc;
  if (1 < *argc) {
    arg_string.field_2._8_8_ = argv + 1;
    iVar5 = 1;
    do {
      StreamableToString<wchar_t*>((string *)local_60,(internal *)(argv + iVar5),in_RDX);
      auVar4 = local_60;
      bVar1 = ParseGoogleTestFlag((char *)local_60);
      in_RDX = extraout_RDX;
      if (bVar1) {
LAB_0017d80f:
        iVar2 = *argc;
        if (iVar2 != iVar5) {
          in_RDX = (wchar_t **)(arg_string.field_2._8_8_ + (long)iVar5 * 8);
          lVar3 = 0;
          do {
            in_RDX[lVar3 + -1] = in_RDX[lVar3];
            lVar3 = lVar3 + 1;
          } while (iVar2 - iVar5 != (int)lVar3);
        }
        *argc = iVar2 + -1;
        iVar5 = iVar5 + -1;
      }
      else {
        bVar1 = ParseStringFlag((char *)auVar4,"flagfile",(string *)&FLAGS_gtest_flagfile_abi_cxx11_
                               );
        if (bVar1) {
          LoadFlagsFromFile((string *)&FLAGS_gtest_flagfile_abi_cxx11_);
          in_RDX = extraout_RDX_00;
          goto LAB_0017d80f;
        }
        iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((string *)local_60,"--help");
        in_RDX = extraout_RDX_01;
        if (iVar2 == 0) {
LAB_0017d895:
          g_help_flag = '\x01';
        }
        else {
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((string *)local_60,"-h");
          in_RDX = extraout_RDX_02;
          if (iVar2 == 0) goto LAB_0017d895;
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((string *)local_60,"-?");
          in_RDX = extraout_RDX_03;
          if (iVar2 == 0) goto LAB_0017d895;
          iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare((string *)local_60,"/?");
          in_RDX = extraout_RDX_04;
          if (iVar2 == 0) goto LAB_0017d895;
          bVar1 = HasGoogleTestFlagPrefix((char *)auVar4);
          in_RDX = extraout_RDX_05;
          if (bVar1) goto LAB_0017d895;
        }
      }
      auVar4 = local_60;
      if (local_60 != (undefined1  [8])&arg_string._M_string_length) {
        operator_delete((void *)local_60,arg_string._M_string_length + 1);
        in_RDX = extraout_RDX_06;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded((char *)auVar4);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    bool remove_flag = false;
    if (ParseGoogleTestFlag(arg)) {
      remove_flag = true;
#if GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (ParseStringFlag(arg, kFlagfileFlag, &GTEST_FLAG(flagfile))) {
      LoadFlagsFromFile(GTEST_FLAG(flagfile));
      remove_flag = true;
#endif  // GTEST_USE_OWN_FLAGFILE_FLAG_
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }

    if (remove_flag) {
      // Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}